

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O3

void diy::
     reduce<diy::detail::AllToAllReduce<void(*)(void*,diy::ReduceProxy_const&)>,diy::RegularSwapPartners,diy::detail::SkipIntermediate>
               (Master *master,Assigner *assigner,RegularSwapPartners *partners,
               AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> *reduce,
               SkipIntermediate *skip)

{
  int iVar1;
  size_t sVar2;
  mapped_type *this;
  mapped_type *this_00;
  int iVar3;
  int round_;
  uint uVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> incoming_gids;
  ulong local_1a0;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  SkipIntermediate *local_160;
  Assigner *local_158;
  AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> *local_150;
  _Any_data local_148;
  code *local_138;
  int *local_128;
  IncomingRoundMap *local_120;
  ReductionFunctor<void,_diy::RegularSwapPartners> local_118;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_160 = skip;
  local_158 = assigner;
  local_150 = reduce;
  local_168 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_168->_M_use_count = 1;
  local_168->_M_weak_count = 1;
  local_168->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001da320;
  iVar1 = master->expected_;
  if ((partners->super_RegularPartners).kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (partners->super_RegularPartners).kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_1a0._0_4_ = 0;
    uVar4 = (uint)local_1a0;
  }
  else {
    local_120 = &master->incoming_;
    local_128 = &master->exchange_round_;
    local_1a0 = 0;
    do {
      std::function<void(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&)>::
      function<diy::detail::AllToAllReduce<void(*)(void*,diy::ReduceProxy_const&)>const&,void>
                ((function<void(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&)> *)
                 local_148._M_pod_data,local_150);
      round_ = (int)local_1a0;
      detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
                (&local_118,round_,(Callback *)&local_148,partners,local_158);
      sVar2 = local_160->rounds;
      local_188._8_8_ = 0;
      local_188._M_unused._M_object = operator_new(0x18);
      *(int *)local_188._M_unused._0_8_ = round_;
      *(RegularSwapPartners **)((long)local_188._M_unused._0_8_ + 8) = partners;
      *(size_t *)((long)local_188._M_unused._0_8_ + 0x10) = sVar2;
      local_170 = Catch::clara::std::
                  _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::SkipIntermediate>_>
                  ::_M_invoke;
      local_178 = Catch::clara::std::
                  _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::SkipIntermediate>_>
                  ::_M_manager;
      Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
                (master,&local_118,(Skip *)&local_188);
      if (local_178 != (code *)0x0) {
        (*local_178)(&local_188,&local_188,__destroy_functor);
      }
      if (local_118.partners.super_RegularPartners.steps_.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
          (pointer)0x0) {
        operator_delete(local_118.partners.super_RegularPartners.steps_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.partners.super_RegularPartners.steps_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.partners.super_RegularPartners.steps_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_118.partners.super_RegularPartners.kvs_.
          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.partners.super_RegularPartners.kvs_.
                        super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.partners.super_RegularPartners.kvs_.
                              super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.partners.super_RegularPartners.kvs_.
                              super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_118.partners.super_RegularPartners.divisions_.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
          (pointer)0x0) {
        operator_delete(local_118.partners.super_RegularPartners.divisions_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.partners.super_RegularPartners.divisions_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.partners.super_RegularPartners.divisions_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_118.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_118.reduce.super__Function_base._M_manager)
                  ((_Any_data *)&local_118.reduce,(_Any_data *)&local_118.reduce,__destroy_functor);
      }
      if (local_138 != (code *)0x0) {
        (*local_138)(&local_148,&local_148,__destroy_functor);
      }
      Master::execute(master);
      if ((int)((ulong)((long)(master->blocks_).elements_.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(master->blocks_).elements_.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) == 0) {
        iVar3 = 0;
      }
      else {
        uVar4 = 0;
        iVar3 = 0;
        do {
          local_118._0_8_ = (pointer)0x0;
          local_118.reduce.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
          local_118.reduce.super__Function_base._M_functor._8_8_ = 0;
          RegularPartners::fill
                    (&partners->super_RegularPartners,round_,
                     (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar4],
                     (vector<int,_std::allocator<int>_> *)&local_118);
          uVar5 = (long)local_118.reduce.super__Function_base._M_functor._M_unused._0_8_ -
                  local_118._0_8_;
          local_148._0_4_ =
               (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar4];
          this = Catch::clara::std::
                 map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
                 ::operator[](local_120,local_128);
          this_00 = Catch::clara::std::
                    map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
                    ::operator[](&this->map,(key_type *)local_148._M_pod_data);
          concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
          ::clear(this_00);
          if ((pointer)local_118._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_118._0_8_,
                            local_118.reduce.super__Function_base._M_functor._8_8_ - local_118._0_8_
                           );
          }
          iVar3 = iVar3 + (int)(uVar5 >> 2);
          uVar4 = uVar4 + 1;
        } while (uVar4 < (uint)((ulong)((long)(master->blocks_).elements_.
                                              super__Vector_base<void_*,_std::allocator<void_*>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(master->blocks_).elements_.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      master->expected_ = iVar3;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_80 = Catch::clara::std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
      local_88 = Catch::clara::std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_60 = Catch::clara::std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
      local_68 = Catch::clara::std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_40 = Catch::clara::std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
      local_48 = Catch::clara::std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
      Master::flush(master,false,(MemoryManagement *)&local_98);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      local_1a0 = (ulong)(round_ + 1U);
      uVar4 = round_ + 1U;
    } while (local_1a0 <
             (ulong)((long)(partners->super_RegularPartners).kvs_.
                           super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(partners->super_RegularPartners).kvs_.
                           super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_1a0._0_4_ = uVar4;
  std::function<void(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&)>::
  function<diy::detail::AllToAllReduce<void(*)(void*,diy::ReduceProxy_const&)>const&,void>
            ((function<void(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&)> *)
             local_148._M_pod_data,local_150);
  detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
            (&local_118,(uint)local_1a0,(Callback *)&local_148,partners,local_158);
  sVar2 = local_160->rounds;
  local_188._8_8_ = 0;
  local_188._M_unused._M_object = operator_new(0x18);
  *(uint *)local_188._M_unused._0_8_ = (uint)local_1a0;
  *(RegularSwapPartners **)((long)local_188._M_unused._0_8_ + 8) = partners;
  *(size_t *)((long)local_188._M_unused._0_8_ + 0x10) = sVar2;
  local_170 = Catch::clara::std::
              _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::SkipIntermediate>_>
              ::_M_invoke;
  local_178 = Catch::clara::std::
              _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::SkipIntermediate>_>
              ::_M_manager;
  Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
            (master,&local_118,(Skip *)&local_188);
  if (local_178 != (code *)0x0) {
    (*local_178)(&local_188,&local_188,__destroy_functor);
  }
  if (local_118.partners.super_RegularPartners.steps_.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.partners.super_RegularPartners.steps_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_118.partners.super_RegularPartners.steps_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_118.partners.super_RegularPartners.steps_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_118.partners.super_RegularPartners.kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.partners.super_RegularPartners.kvs_.
                    super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.partners.super_RegularPartners.kvs_.
                          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.partners.super_RegularPartners.kvs_.
                          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.partners.super_RegularPartners.divisions_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_118.partners.super_RegularPartners.divisions_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_118.partners.super_RegularPartners.divisions_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_118.partners.super_RegularPartners.divisions_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_118.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_118.reduce.super__Function_base._M_manager)
              ((_Any_data *)&local_118.reduce,(_Any_data *)&local_118.reduce,__destroy_functor);
  }
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  master->expected_ = iVar1;
  Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}